

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

ssize_t recv(int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  rpchook_t *prVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  ssize_t sVar6;
  uint *puVar7;
  uint __timeout;
  pollfd local_38;
  
  if (g_sys_recv_func == (recv_pfn_t)0x0) {
    g_sys_recv_func = (recv_pfn_t)dlsym(0xffffffffffffffff,"recv");
  }
  bVar4 = co_is_enable_sys_hook();
  if ((((bVar4) && ((uint)__fd < 1000000)) &&
      (prVar2 = g_rpchook_socket_fd[(uint)__fd], prVar2 != (rpchook_t *)0x0)) &&
     ((prVar2->user_flag & 0x800) == 0)) {
    auVar3 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar2->read_timeout).tv_usec);
    __timeout = ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) +
                (int)(prVar2->read_timeout).tv_sec * 1000;
    local_38.events = 0x19;
    local_38.revents = 0;
    local_38.fd = __fd;
    uVar5 = poll(&local_38,1,__timeout);
    sVar6 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",(ulong)(uint)__fd,
                 sVar6,(ulong)uVar1,(ulong)uVar5,(ulong)__timeout);
      uVar5 = 0x7c5;
      if (uVar1 != 0xb) {
        uVar5 = uVar1;
      }
      *puVar7 = uVar5;
    }
    return sVar6;
  }
  sVar6 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
  return sVar6;
}

Assistant:

ssize_t recv( int socket, void *buffer, size_t length, int flags )
{
	HOOK_SYS_FUNC( recv );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	rpchook_t *lp = get_by_fd( socket );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) ) 
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );

	struct pollfd pf = { 0 };
	pf.fd = socket;
	pf.events = ( POLLIN | POLLERR | POLLHUP );

	int pollret = poll( &pf,1,timeout );

	ssize_t readret = g_sys_recv_func( socket,buffer,length,flags );

	if( readret < 0 )
	{
		int _set_errno = errno;
		co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",
					socket,readret,errno,pollret,timeout);
		errno = _set_errno;
		if(errno == EAGAIN){
			errno = LIBCO_POLL_TIMEOUT;
		}

	}

	return readret;
	
}